

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateUnaryOp(ExpressionTranslateContext *ctx,ExprUnaryOp *expression)

{
  uint uVar1;
  
  uVar1 = *(int *)&(expression->super_ExprBase).field_0x2c - 1;
  if (uVar1 < 4) {
    Print(ctx,&DAT_001e6148 + *(int *)(&DAT_001e6148 + (ulong)uVar1 * 4));
    Translate(ctx,expression->value);
    Print(ctx,")");
    return;
  }
  __assert_fail("!\"unknown type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                ,0x2e8,"void TranslateUnaryOp(ExpressionTranslateContext &, ExprUnaryOp *)");
}

Assistant:

void TranslateUnaryOp(ExpressionTranslateContext &ctx, ExprUnaryOp *expression)
{
	switch(expression->op)
	{
	case SYN_UNARY_OP_PLUS:
		Print(ctx, "+(");
		break;
	case SYN_UNARY_OP_NEGATE:
		Print(ctx, "-(");
		break;
	case SYN_UNARY_OP_BIT_NOT:
		Print(ctx, "~(");
		break;
	case SYN_UNARY_OP_LOGICAL_NOT:
		Print(ctx, "!(");
		break;
	default:
		assert(!"unknown type");
	}

	Translate(ctx, expression->value);
	Print(ctx, ")");
}